

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::deleteFramebuffers
          (ReferenceContext *this,int numFramebuffers,deUint32 *framebuffers)

{
  Framebuffer *framebuffer;
  ulong uVar1;
  
  if (0 < numFramebuffers) {
    uVar1 = 0;
    do {
      if (framebuffers[uVar1] == 0) {
        framebuffer = (Framebuffer *)0x0;
      }
      else {
        framebuffer = rc::ObjectManager<sglr::rc::Framebuffer>::find
                                (&this->m_framebuffers,framebuffers[uVar1]);
      }
      if (framebuffer != (Framebuffer *)0x0) {
        deleteFramebuffer(this,framebuffer);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)numFramebuffers != uVar1);
  }
  return;
}

Assistant:

void ReferenceContext::deleteFramebuffers (int numFramebuffers, const deUint32* framebuffers)
{
	for (int i = 0; i < numFramebuffers; i++)
	{
		deUint32		name		= framebuffers[i];
		Framebuffer*	framebuffer	= name ? m_framebuffers.find(name) : DE_NULL;

		if (framebuffer)
			deleteFramebuffer(framebuffer);
	}
}